

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

bool binary_fuse8_contain(uint64_t key,binary_fuse8_t *filter)

{
  uint64_t uVar1;
  long in_RSI;
  binary_hashes_t bVar2;
  binary_hashes_t hashes;
  uint8_t f;
  uint64_t hash;
  uint64_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  binary_fuse8_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar3;
  
  uVar1 = binary_fuse_mix_split
                    (CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  uVar1 = binary_fuse8_fingerprint(uVar1);
  uVar3 = CONCAT13((char)uVar1,(int3)in_stack_ffffffffffffffe4);
  bVar2 = binary_fuse8_hash_batch
                    (CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return (byte)((uint)uVar3 >> 0x18) ==
         (byte)(*(byte *)(*(long *)(in_RSI + 0x20) + (bVar2._0_8_ & 0xffffffff)) ^
                *(byte *)(*(long *)(in_RSI + 0x20) + (bVar2._0_8_ >> 0x20)) ^
               *(byte *)(*(long *)(in_RSI + 0x20) + (ulong)bVar2.h2));
}

Assistant:

static inline bool binary_fuse8_contain(uint64_t key,
                                        const binary_fuse8_t *filter) {
  uint64_t hash = binary_fuse_mix_split(key, filter->Seed);
  uint8_t f = binary_fuse8_fingerprint(hash);
  binary_hashes_t hashes = binary_fuse8_hash_batch(hash, filter);
  f ^= filter->Fingerprints[hashes.h0] ^ filter->Fingerprints[hashes.h1] ^
       filter->Fingerprints[hashes.h2];
  return f == 0;
}